

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patternprops.cpp
# Opt level: O2

UChar * icu_63::PatternProps::trimWhiteSpace(UChar *s,int32_t *length)

{
  UBool UVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  UChar *pUVar6;
  
  uVar2 = *length;
  uVar4 = (ulong)uVar2;
  if (((int)uVar2 < 1) ||
     ((UVar1 = isWhiteSpace((uint)(ushort)*s), UVar1 == '\0' &&
      (UVar1 = isWhiteSpace((uint)(ushort)s[uVar4 - 1]), UVar1 == '\0')))) {
    return s;
  }
  uVar3 = 0;
  while( true ) {
    uVar5 = uVar2;
    if (uVar4 == uVar3) goto LAB_0028a42d;
    UVar1 = isWhiteSpace((uint)(ushort)s[uVar3]);
    if (UVar1 == '\0') break;
    uVar3 = uVar3 + 1;
  }
  uVar2 = uVar2 + 1;
  pUVar6 = s + uVar4;
  do {
    pUVar6 = pUVar6 + -1;
    UVar1 = isWhiteSpace((uint)(ushort)*pUVar6);
    uVar2 = uVar2 - 1;
  } while (UVar1 != '\0');
  uVar4 = uVar3;
  uVar5 = (uint)uVar3;
LAB_0028a42d:
  *length = uVar2 - uVar5;
  return s + uVar4;
}

Assistant:

const UChar *
PatternProps::trimWhiteSpace(const UChar *s, int32_t &length) {
    if(length<=0 || (!isWhiteSpace(s[0]) && !isWhiteSpace(s[length-1]))) {
        return s;
    }
    int32_t start=0;
    int32_t limit=length;
    while(start<limit && isWhiteSpace(s[start])) {
        ++start;
    }
    if(start<limit) {
        // There is non-white space at start; we will not move limit below that,
        // so we need not test start<limit in the loop.
        while(isWhiteSpace(s[limit-1])) {
            --limit;
        }
    }
    length=limit-start;
    return s+start;
}